

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate2.cpp
# Opt level: O2

STAmount *
jbcoin::multiplyRound(STAmount *__return_storage_ptr__,STAmount *amount,Rate *rate,bool roundUp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  mantissa_type mVar5;
  STAmount SStack_68;
  
  if (rate->value != 0) {
    if (rate->value == parityRate) {
      (__return_storage_ptr__->super_STBase).fName = (amount->super_STBase).fName;
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
      uVar1 = *(undefined8 *)((amount->mIssue).currency.pn + 2);
      uVar2 = *(undefined8 *)((amount->mIssue).currency.pn + 4);
      uVar3 = *(undefined8 *)((amount->mIssue).account.pn + 1);
      uVar4 = *(undefined8 *)((amount->mIssue).account.pn + 3);
      mVar5 = amount->mValue;
      *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn =
           *(undefined8 *)(amount->mIssue).currency.pn;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar1;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar2;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar3;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) = uVar4;
      __return_storage_ptr__->mValue = mVar5;
      *(undefined8 *)((long)&__return_storage_ptr__->mValue + 6) =
           *(undefined8 *)((long)&amount->mValue + 6);
    }
    else {
      detail::as_amount(&SStack_68,rate);
      mulRound(__return_storage_ptr__,amount,&SStack_68,&amount->mIssue,roundUp);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("rate.value != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/Rate2.cpp"
                ,0x3b,"STAmount jbcoin::multiplyRound(const STAmount &, const Rate &, bool)");
}

Assistant:

STAmount
multiplyRound (
    STAmount const& amount,
    Rate const& rate,
    bool roundUp)
{
    assert (rate.value != 0);

    if (rate == parityRate)
        return amount;

    return mulRound (
        amount,
        detail::as_amount(rate),
        amount.issue(),
        roundUp);
}